

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvode_io.c
# Opt level: O1

int CVodeGetNumStepSolveFails(void *cvode_mem,long *nncfails)

{
  int iVar1;
  
  if (cvode_mem == (void *)0x0) {
    iVar1 = -0x15;
    cvProcessError((CVodeMem)0x0,-0x15,"CVODE","CVodeGetNumStepSolveFails",
                   "cvode_mem = NULL illegal.");
  }
  else {
    *nncfails = *(long *)((long)cvode_mem + 0x368);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int CVodeGetNumStepSolveFails(void *cvode_mem, long int *nncfails)
{
  CVodeMem cv_mem;

  if (cvode_mem==NULL) {
    cvProcessError(NULL, CV_MEM_NULL, "CVODE", "CVodeGetNumStepSolveFails",
                   MSGCV_NO_MEM);
    return(CV_MEM_NULL);
  }

  cv_mem = (CVodeMem) cvode_mem;

  *nncfails = cv_mem->cv_ncfn;

  return(CV_SUCCESS);
}